

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpVirtualDir_set_GetInfoCallback(VDCallback_GetInfo callback)

{
  if (callback != (VDCallback_GetInfo)0x0) {
    virtualDirCallback.get_info = callback;
    return 0;
  }
  return -0x65;
}

Assistant:

int UpnpVirtualDir_set_GetInfoCallback(VDCallback_GetInfo callback)
{
	int ret = UPNP_E_SUCCESS;
	if (!callback) {
		ret = UPNP_E_INVALID_PARAM;
	} else {
		virtualDirCallback.get_info = callback;
	}

	return ret;
}